

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O0

string * str::concat<char_const(&)[1],std::__cxx11::string_const&>
                   (string_view delimiter,char (*arg) [1],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string_view delimiter_00;
  char *in_RCX;
  char *in_RDX;
  size_t in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostringstream stream;
  ostringstream *this;
  ostringstream local_1a0 [384];
  char *local_20;
  size_t local_18;
  char *pcStack_10;
  
  this = local_1a0;
  local_20 = in_RCX;
  local_18 = in_RSI;
  pcStack_10 = in_RDX;
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,local_20);
  delimiter_00._M_str = pcStack_10;
  delimiter_00._M_len = local_18;
  _concat<std::__cxx11::string_const&>((ostringstream *)this,delimiter_00,in_RDI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string concat(std::string_view delimiter, Arg&& arg, Args&&... args) {
        static_assert(sizeof...(Args) > 0, "This function needs at least 2 parameters");

        std::ostringstream stream;
        stream << arg;
        _concat(stream, delimiter, std::forward<Args>(args)...);
        return stream.str();
    }